

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManRandomTest1(void)

{
  uint uVar1;
  FILE *__stream;
  uint local_18;
  uint period;
  uint lfsr;
  FILE *pFile;
  
  local_18 = 0;
  __stream = fopen("rand.txt","w");
  do {
    uVar1 = Aig_ManRandom(0);
    local_18 = local_18 + 1;
    fprintf(__stream,"%10d : %10d ",(ulong)local_18,(ulong)uVar1);
    fprintf(__stream,"\n");
    if (local_18 == 20000) break;
  } while (uVar1 != 1);
  fclose(__stream);
  return;
}

Assistant:

void Aig_ManRandomTest1()
{
    FILE * pFile;
    unsigned int lfsr;
    unsigned int period = 0; 
    pFile = fopen( "rand.txt", "w" );
    do {
        lfsr = Aig_ManRandom( 0 );
        ++period;
        fprintf( pFile, "%10d : %10d ", period, lfsr );
//        Extra_PrintBinary( pFile, &lfsr, 32 );
        fprintf( pFile, "\n" );
        if ( period == 20000 )
            break;
    } while(lfsr != 1u);
    fclose( pFile );
}